

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Tuple4(Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e0,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e1,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e2,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e3_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e1_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e0_local;
  Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)e0);
  std::__cxx11::string::string((string *)&this->b,(string *)e1);
  std::__cxx11::string::string((string *)&this->c,(string *)e2);
  std::__cxx11::string::string((string *)&this->d,(string *)e3);
  return;
}

Assistant:

explicit Tuple4 (const T0& e0 = T0(),
					 const T1& e1 = T1(),
					 const T2& e2 = T2(),
					 const T3& e3 = T3())
		: a	(e0)
		, b	(e1)
		, c	(e2)
		, d	(e3)
	{
	}